

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

void __thiscall luna::GC::SetObjectGen(GC *this,GCObject *obj,GCGeneration gen)

{
  uint *puVar1;
  
  if (gen != GCGen0) {
    if (gen == GCGen2) {
      this = (GC *)&this->gen2_;
    }
    else {
      if (gen != GCGen1) {
        __assert_fail("gen_info",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/GC.cpp"
                      ,0xef,"void luna::GC::SetObjectGen(GCObject *, GCGeneration)");
      }
      this = (GC *)&this->gen1_;
    }
  }
  obj->field_0x10 = obj->field_0x10 & 0xfc | (byte)gen;
  obj->next_ = (this->gen0_).gen_;
  (this->gen0_).gen_ = obj;
  puVar1 = &(this->gen0_).count_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void GC::SetObjectGen(GCObject *obj, GCGeneration gen)
    {
        GenInfo *gen_info = nullptr;

        switch (gen)
        {
            case GCGen0:
                gen_info = &gen0_;
                break;
            case GCGen1:
                gen_info = &gen1_;
                break;
            case GCGen2:
                gen_info = &gen2_;
                break;
        }

        assert(gen_info);

        obj->generation_ = gen;
        obj->next_ = gen_info->gen_;
        gen_info->gen_ = obj;
        gen_info->count_++;
    }